

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetRepaintManager::markDirty<QRect>
          (QWidgetRepaintManager *this,QRect *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  QWidgetRepaintManager *this_00;
  undefined8 uVar1;
  QWidgetRepaintManager QVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  QGraphicsEffect *this_01;
  undefined4 uVar8;
  QWidgetPrivate *this_02;
  QRect QVar9;
  QRect QVar10;
  QRect QVar11;
  bool bVar12;
  char cVar13;
  byte bVar14;
  Representation RVar15;
  QLoggingCategory *pQVar16;
  QPoint QVar17;
  ulong uVar18;
  Representation RVar19;
  long in_FS_OFFSET;
  QRect QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QRect local_c8;
  QRect local_b8;
  QRect local_a8;
  undefined1 local_98 [8];
  undefined1 local_90 [16];
  QDebug local_80;
  QArrayData *local_78;
  QWidgetData *pQStack_70;
  double local_68;
  double local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar16 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar16->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar16->name;
    local_58.x1.m_i = 2;
    local_58.y1.m_i = 0;
    local_58.x2.m_i = 0;
    local_58.y2.m_i = 0;
    uStack_48 = 0;
    local_44 = 0;
    QMessageLogger::info();
    uVar6 = local_c8._0_8_;
    QVar21.m_data = (storage_type *)0x7;
    QVar21.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_c8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8._0_8_,' ');
    }
    local_98._0_4_ = local_c8.x1.m_i;
    local_98._4_4_ = local_c8.y1.m_i;
    *(int *)(local_c8._0_8_ + 0x28) = *(int *)(local_c8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_b8,(QRect *)local_98);
    uVar6 = local_b8._0_8_;
    QVar22.m_data = (storage_type *)0x2;
    QVar22.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._0_8_,' ');
    }
    local_90._0_4_ = local_b8.x1.m_i;
    local_90._4_4_ = local_b8.y1.m_i;
    *(int *)(local_b8._0_8_ + 0x28) = *(int *)(local_b8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_a8,(QWidget *)local_90);
    uVar6 = local_a8._0_8_;
    QVar23.m_data = (storage_type *)0x5;
    QVar23.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar23);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    uVar6 = local_a8._0_8_;
    QVar24.m_data = (storage_type *)0x4;
    QVar24.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar24);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    *(int *)(local_a8._0_8_ + 0x28) = *(int *)(local_a8._0_8_ + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)(local_90 + 8),(QMetaObject *)(ulong)updateTime,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug((QDebug *)(local_90 + 8));
    QDebug::~QDebug((QDebug *)&local_a8);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)&local_c8);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  lVar7._0_4_ = r->x1;
  lVar7._4_4_ = (r->y1).m_i;
  lVar4._0_4_ = r->x2;
  lVar4._4_4_ = r->y2;
  QVar10 = *r;
  QVar20 = *r;
  local_a8._0_8_ = lVar7;
  local_a8._8_8_ = lVar4;
  bVar12 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  lVar5 = *(long *)&widget->field_0x8;
  if (bVar12) {
    cVar13 = QRegion::isEmpty();
    if (cVar13 == '\0') {
      cVar13 = qt_region_strictContains((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_a8);
      QVar10.x2.m_i = local_b8.x2.m_i;
      QVar10.y2.m_i = local_b8.y2.m_i;
      QVar10.x1.m_i = local_b8.x1.m_i;
      QVar10.y1.m_i = local_b8.y1.m_i;
      QVar20.x2.m_i = local_c8.x2.m_i;
      QVar20.y2.m_i = local_c8.y2.m_i;
      QVar20.x1.m_i = local_c8.x1.m_i;
      QVar20.y1.m_i = local_c8.y1.m_i;
      if (cVar13 == '\0') {
        cVar13 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        QVar11.x2.m_i = local_b8.x2.m_i;
        QVar11.y2.m_i = local_b8.y2.m_i;
        QVar11.x1.m_i = local_b8.x1.m_i;
        QVar11.y1.m_i = local_b8.y1.m_i;
        QVar9.x2.m_i = local_c8.x2.m_i;
        QVar9.y2.m_i = local_c8.y2.m_i;
        QVar9.x1.m_i = local_c8.x1.m_i;
        QVar9.y1.m_i = local_c8.y1.m_i;
        if ((updateTime != UpdateNow) && (local_c8 = QVar9, local_b8 = QVar11, cVar13 == '\0'))
        goto LAB_0031e36c;
      }
      else {
        local_c8 = QVar20;
        local_b8 = QVar10;
        if (updateTime != UpdateNow) goto LAB_0031e36c;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
      uVar6 = *(undefined8 *)(*(long *)&widget->field_0x8 + 0xe0);
      *(ulong *)(*(long *)&widget->field_0x8 + 0xe0) = CONCAT44(local_58.y1.m_i,local_58.x1.m_i);
      local_58.x1.m_i = (int)uVar6;
      local_58.y1.m_i = (int)((ulong)uVar6 >> 0x20);
      QRegion::~QRegion((QRegion *)&local_58);
    }
  }
  else if ((*(uint *)(lVar5 + 0x250) >> 0x18 & 1) == 0) {
    if ((*(QGraphicsEffect **)(lVar5 + 200) != (QGraphicsEffect *)0x0) &&
       (bVar12 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar5 + 200)), QVar20 = QVar10,
       bVar12)) {
      local_78 = (QArrayData *)(double)(int)(undefined4)lVar7;
      pQStack_70 = (QWidgetData *)(double)lVar7._4_4_;
      local_68 = (double)(((long)(int)(undefined4)lVar4 - (long)(int)(undefined4)lVar7) + 1);
      local_60 = (double)(((lVar4 >> 0x20) - (lVar7 >> 0x20)) + 1);
      (**(code **)(**(long **)(lVar5 + 200) + 0x60))(&local_58);
      QVar20 = (QRect)QRectF::toAlignedRect();
      lVar7._4_4_ = QVar20.y1.m_i;
    }
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    local_b8 = QVar20;
    QVar17 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_58);
    RVar15 = QVar17.xp.m_i;
    local_c8.x1.m_i = QVar20.x1.m_i.m_i + RVar15.m_i;
    RVar19 = QVar17.yp.m_i;
    local_c8.y1.m_i = lVar7._4_4_ + RVar19.m_i;
    uVar18 = (ulong)QVar17 & 0xffffffff00000000;
    local_c8._8_8_ =
         (ulong)(uint)(QVar20.x2.m_i.m_i + RVar15.m_i) | QVar20._8_8_ + uVar18 & 0xffffffff00000000;
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    uVar6 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x1c);
    uVar1 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x14);
    local_58.x2.m_i = (int)uVar6 - (int)uVar1;
    local_58.y2.m_i = (int)((ulong)uVar6 >> 0x20) - (int)((ulong)uVar1 >> 0x20);
    local_c8 = (QRect)QRect::operator&(&local_c8,&local_58);
    this_00 = this + 0x10;
    cVar13 = qt_region_strictContains((QRegion *)this_00,&local_c8);
    if (cVar13 == '\0') {
      if (bufferState == BufferInvalid) {
        bVar14 = QRegion::isEmpty();
        QVar2 = this[0x88];
        lVar7 = *(long *)&widget->field_0x8;
        this_01 = *(QGraphicsEffect **)(lVar7 + 200);
        if (this_01 == (QGraphicsEffect *)0x0) {
          local_58.x1.m_i = (r->x1).m_i + RVar15.m_i;
          local_58.y1.m_i = (r->y1).m_i + RVar19.m_i;
          local_58.y2.m_i = RVar19.m_i + (r->y2).m_i;
          local_58.x2.m_i = (r->x2).m_i + RVar15.m_i;
          QRegion::operator+=((QRegion *)this_00,&local_58);
        }
        else {
          bVar12 = QGraphicsEffect::isEnabled(this_01);
          if (bVar12) {
            uVar3 = r->x1;
            uVar8 = r->y1;
            local_78 = (QArrayData *)(double)(int)uVar3;
            pQStack_70 = (QWidgetData *)(double)(int)uVar8;
            local_68 = (double)(((long)(r->x2).m_i - (long)(int)uVar3) + 1);
            local_60 = (double)(((long)(r->y2).m_i - (long)(int)uVar8) + 1);
            (**(code **)(**(long **)(lVar7 + 200) + 0x60))(&local_58);
            QVar20 = (QRect)QRectF::toAlignedRect();
          }
          else {
            QVar20 = *r;
          }
          local_58.x1.m_i = QVar20.x1.m_i.m_i + RVar15.m_i;
          local_58.x2.m_i = RVar15.m_i + QVar20.x2.m_i.m_i;
          local_58.y1.m_i = (int)(QVar20._0_8_ + uVar18 >> 0x20);
          local_58.y2.m_i = (int)(QVar20._8_8_ + uVar18 >> 0x20);
          QRegion::operator+=((QRegion *)this_00,&local_58);
        }
        if (updateTime != UpdateNow && (((byte)QVar2 ^ 1) & bVar14) == 0) goto LAB_0031e36c;
      }
      else if (*(long *)(this + 0x28) == 0) {
        QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
        addDirtyWidget(this,widget,(QRegion *)&local_58);
        QRegion::~QRegion((QRegion *)&local_58);
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
          QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
          addDirtyWidget(this,widget,(QRegion *)&local_58);
          QRegion::~QRegion((QRegion *)&local_58);
        }
        else {
          cVar13 = qt_region_strictContains
                             ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_b8);
          if (cVar13 == '\0') {
            this_02 = *(QWidgetPrivate **)&widget->field_0x8;
            if (this_02->graphicsEffect != (QGraphicsEffect *)0x0) {
              QVar20 = QWidgetPrivate::effectiveRectFor(this_02,r);
              r = &local_58;
              local_58.x1 = QVar20.x1.m_i;
              local_58.y1 = QVar20.y1.m_i;
              local_58.x2 = QVar20.x2.m_i;
              local_58.y2 = QVar20.y2.m_i;
              this_02 = *(QWidgetPrivate **)&widget->field_0x8;
            }
            QRegion::operator+=(&this_02->dirty,r);
          }
        }
        if (updateTime != UpdateNow) goto LAB_0031e36c;
        updateTime = UpdateNow;
      }
    }
    else {
      bVar12 = updateTime != UpdateNow;
      updateTime = UpdateNow;
      if (bVar12) goto LAB_0031e36c;
    }
    widget = *(QWidget **)this;
  }
  else {
    if ((*(uint *)(lVar5 + 0x250) >> 0x13 & 1) == 0) {
      addDirtyRenderToTextureWidget(this,widget);
    }
    if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0)) goto LAB_0031e36c;
    widget = *(QWidget **)this;
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_0031e36c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}